

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall cmExtraEclipseCDT4Generator::Generate(cmExtraEclipseCDT4Generator *this)

{
  bool bVar1;
  int iVar2;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_00;
  const_reference ppcVar3;
  cmMakefile *this_01;
  char *pcVar4;
  undefined8 uVar5;
  bool local_2aa;
  bool local_292;
  allocator local_239;
  string local_238;
  allocator local_211;
  string local_210;
  byte local_1eb;
  byte local_1ea;
  allocator local_1e9;
  string local_1e8;
  byte local_1c3;
  byte local_1c2;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  int local_174;
  undefined1 local_170 [4];
  int version;
  int local_14c;
  int local_148;
  int res;
  uint minorVersion;
  uint majorVersion;
  RegularExpression regex;
  allocator local_59;
  string local_58;
  string local_38 [8];
  string eclipseVersion;
  cmMakefile *mf;
  cmExtraEclipseCDT4Generator *this_local;
  
  this_00 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (this_00,0);
  this_01 = cmLocalGenerator::GetMakefile(*ppcVar3);
  eclipseVersion.field_2._8_8_ = this_01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"CMAKE_ECLIPSE_VERSION",&local_59);
  pcVar4 = cmMakefile::GetSafeDefinition(this_01,&local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar4,(allocator *)((long)&regex.searchstring + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&regex.searchstring + 3));
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&minorVersion,".*([0-9]+\\.[0-9]+).*");
  pcVar4 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::RegularExpression::find((RegularExpression *)&minorVersion,pcVar4);
  if (bVar1) {
    res = 0;
    local_148 = 0;
    cmsys::RegularExpression::match_abi_cxx11_
              ((string *)local_170,(RegularExpression *)&minorVersion,1);
    uVar5 = std::__cxx11::string::c_str();
    iVar2 = __isoc99_sscanf(uVar5,"%u.%u",&res,&local_148);
    std::__cxx11::string::~string((string *)local_170);
    local_14c = iVar2;
    if (iVar2 == 2) {
      local_174 = res * 1000 + local_148;
      if (local_174 < 0xbbe) {
        this->SupportsVirtualFolders = false;
        this->SupportsMachO64Parser = false;
      }
      if (local_174 < 0xbbf) {
        this->SupportsGmakeErrorParser = false;
      }
    }
  }
  pcVar4 = cmMakefile::GetHomeDirectory((cmMakefile *)eclipseVersion.field_2._8_8_);
  std::__cxx11::string::operator=((string *)&this->HomeDirectory,pcVar4);
  pcVar4 = cmMakefile::GetHomeOutputDirectory((cmMakefile *)eclipseVersion.field_2._8_8_);
  std::__cxx11::string::operator=((string *)&this->HomeOutputDirectory,pcVar4);
  uVar5 = eclipseVersion.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_198,"CMAKE_ECLIPSE_GENERATE_LINKED_RESOURCES",&local_199);
  bVar1 = cmMakefile::IsOn((cmMakefile *)uVar5,&local_198);
  this->GenerateLinkedResources = bVar1;
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  bVar1 = std::operator!=(&this->HomeDirectory,&this->HomeOutputDirectory);
  uVar5 = eclipseVersion.field_2._8_8_;
  this->IsOutOfSourceBuild = bVar1;
  local_1c2 = 0;
  local_1c3 = 0;
  local_292 = false;
  if ((this->IsOutOfSourceBuild & 1U) != 0) {
    std::allocator<char>::allocator();
    local_1c2 = 1;
    std::__cxx11::string::string
              ((string *)&local_1c0,"CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT",&local_1c1);
    local_1c3 = 1;
    local_292 = cmMakefile::IsOn((cmMakefile *)uVar5,&local_1c0);
  }
  this->GenerateSourceProject = local_292;
  if ((local_1c3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1c0);
  }
  if ((local_1c2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  }
  uVar5 = eclipseVersion.field_2._8_8_;
  local_1ea = 0;
  local_1eb = 0;
  local_2aa = false;
  if ((this->GenerateSourceProject & 1U) == 0) {
    std::allocator<char>::allocator();
    local_1ea = 1;
    std::__cxx11::string::string
              ((string *)&local_1e8,"ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT",&local_1e9);
    local_1eb = 1;
    local_2aa = cmMakefile::IsOn((cmMakefile *)uVar5,&local_1e8);
  }
  if ((local_1eb & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  if ((local_1ea & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  }
  uVar5 = eclipseVersion.field_2._8_8_;
  if (local_2aa != false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_210,
               "ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT is set to TRUE, but this variable is not supported anymore since CMake 2.8.7.\nEnable CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT instead."
               ,&local_211);
    cmMakefile::IssueMessage((cmMakefile *)uVar5,WARNING,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
  }
  bVar1 = cmsys::SystemTools::IsSubDirectory(&this->HomeOutputDirectory,&this->HomeDirectory);
  uVar5 = eclipseVersion.field_2._8_8_;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_238,
               "The build directory is a subdirectory of the source directory.\nThis is not supported well by Eclipse. It is strongly recommended to use a build directory which is a sibling of the source directory."
               ,&local_239);
    cmMakefile::IssueMessage((cmMakefile *)uVar5,WARNING,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
  }
  if ((this->GenerateSourceProject & 1U) != 0) {
    CreateSourceProjectFile(this);
  }
  CreateProjectFile(this);
  CreateCProjectFile(this);
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)&minorVersion);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::Generate()
{
  const cmMakefile* mf
    = this->GlobalGenerator->GetLocalGenerators()[0]->GetMakefile();

  std::string eclipseVersion = mf->GetSafeDefinition("CMAKE_ECLIPSE_VERSION");
  cmsys::RegularExpression regex(".*([0-9]+\\.[0-9]+).*");
  if (regex.find(eclipseVersion.c_str()))
    {
    unsigned int majorVersion = 0;
    unsigned int minorVersion = 0;
    int res=sscanf(regex.match(1).c_str(), "%u.%u", &majorVersion,
                                                    &minorVersion);
    if (res == 2)
      {
      int version = majorVersion * 1000 + minorVersion;
      if (version < 3006) // 3.6 is Helios
        {
        this->SupportsVirtualFolders = false;
        this->SupportsMachO64Parser = false;
        }
      if (version < 3007) // 3.7 is Indigo
        {
        this->SupportsGmakeErrorParser = false;
        }
      }
    }

  // TODO: Decide if these are local or member variables
  this->HomeDirectory       = mf->GetHomeDirectory();
  this->HomeOutputDirectory = mf->GetHomeOutputDirectory();

  this->GenerateLinkedResources = mf->IsOn(
                                    "CMAKE_ECLIPSE_GENERATE_LINKED_RESOURCES");

  this->IsOutOfSourceBuild = (this->HomeDirectory!=this->HomeOutputDirectory);

  this->GenerateSourceProject = (this->IsOutOfSourceBuild &&
                            mf->IsOn("CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT"));

  if ((this->GenerateSourceProject == false)
    && (mf->IsOn("ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT")))
    {
    mf->IssueMessage(cmake::WARNING,
              "ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT is set to TRUE, "
              "but this variable is not supported anymore since CMake 2.8.7.\n"
              "Enable CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT instead.");
    }

  if (cmSystemTools::IsSubDirectory(this->HomeOutputDirectory,
                                    this->HomeDirectory))
    {
    mf->IssueMessage(cmake::WARNING, "The build directory is a subdirectory "
                     "of the source directory.\n"
                     "This is not supported well by Eclipse. It is strongly "
                     "recommended to use a build directory which is a "
                     "sibling of the source directory.");
    }

  // NOTE: This is not good, since it pollutes the source tree. However,
  //       Eclipse doesn't allow CVS/SVN to work when the .project is not in
  //       the cvs/svn root directory. Hence, this is provided as an option.
  if (this->GenerateSourceProject)
    {
    // create .project file in the source tree
    this->CreateSourceProjectFile();
    }

  // create a .project file
  this->CreateProjectFile();

  // create a .cproject file
  this->CreateCProjectFile();
}